

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerLdEnv(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *in_RAX;
  Instr *pIVar4;
  undefined4 *puVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  AddrOpnd *pAVar6;
  Opnd *local_38;
  Opnd *functionObjOpnd;
  
  pOVar1 = instr->m_src1;
  local_38 = in_RAX;
  pIVar4 = LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,instr,&local_38);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f54,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar3) goto LAB_0055c92d;
    *puVar5 = 0;
  }
  if (pOVar1 != (Opnd *)0x0) {
    bVar3 = IR::Opnd::IsRegOpnd(local_38);
    if (!bVar3) {
      bVar3 = IR::Opnd::IsAddrOpnd(local_38);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6f5d,"(functionObjOpnd->IsAddrOpnd())","functionObjOpnd->IsAddrOpnd()"
                          );
        if (!bVar3) {
LAB_0055c92d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pAVar6 = IR::Opnd::AsAddrOpnd(local_38);
      newSrc = (IndirOpnd *)
               IR::MemRefOpnd::New((void *)((long)pAVar6->m_address + 0x30),TyUint64,this->m_func,
                                   AddrOpndKindDynamicFunctionEnvironmentRef);
      goto LAB_0055c908;
    }
  }
  baseOpnd = IR::Opnd::AsRegOpnd(local_38);
  newSrc = IR::IndirOpnd::New(baseOpnd,0x30,TyUint64,this->m_func,false);
LAB_0055c908:
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign(instr);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerLdEnv(IR::Instr * instr)
{
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * functionObjOpnd;
    IR::Instr * instrPrev = this->m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Assert(!instr->GetSrc1());
    if (src1 == nullptr || functionObjOpnd->IsRegOpnd())
    {
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
            Js::ScriptFunction::GetOffsetOfEnvironment(), TyMachPtr, m_func);
        instr->SetSrc1(indirOpnd);
    }
    else
    {
        Assert(functionObjOpnd->IsAddrOpnd());
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        IR::MemRefOpnd* functionEnvMemRefOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::ScriptFunction::GetOffsetOfEnvironment()),
            TyMachPtr, this->m_func, IR::AddrOpndKindDynamicFunctionEnvironmentRef);
        instr->SetSrc1(functionEnvMemRefOpnd);
    }

    LowererMD::ChangeToAssign(instr);
    return instrPrev;
}